

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O2

void ym2612_update_one(void *chip,UINT32 length,DEV_SMPL **buffer)

{
  FM_OPN *OPN;
  FM_CH *CH;
  FM_CH *CH_00;
  FM_CH *CH_01;
  FM_CH *CH_02;
  FM_CH *CH_03;
  FM_CH *CH_04;
  undefined1 (*pauVar1) [16];
  byte bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int chnum;
  int chnum_00;
  int chnum_01;
  int chnum_02;
  int chnum_03;
  int chnum_04;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  DEV_SMPL *local_68;
  DEV_SMPL *local_60;
  
  iVar3 = 0;
  if (buffer == (DEV_SMPL **)0x0) {
    local_60 = (DEV_SMPL *)0x0;
    local_68 = (DEV_SMPL *)0x0;
  }
  else {
    local_68 = *buffer;
    local_60 = buffer[1];
  }
  OPN = (FM_OPN *)((long)chip + 0x208);
  CH = (FM_CH *)((long)chip + 0x4778);
  CH_00 = (FM_CH *)((long)chip + 0x4910);
  if (*(char *)((long)chip + 0x5110) == '\0') {
    iVar3 = *(int *)((long)chip + 0x510c) << 5;
  }
  CH_01 = (FM_CH *)((long)chip + 0x4aa8);
  CH_02 = (FM_CH *)((long)chip + 0x4c40);
  CH_03 = (FM_CH *)((long)chip + 0x4dd8);
  CH_04 = (FM_CH *)((long)chip + 0x4f70);
  refresh_fc_eg_chan(OPN,CH);
  refresh_fc_eg_chan(OPN,CH_00);
  if ((*(byte *)((long)chip + 0x230) & 0xc0) == 0) {
    refresh_fc_eg_chan(OPN,CH_01);
  }
  else if (*(int *)((long)chip + 0x4ad0) == -1) {
    refresh_fc_eg_slot(OPN,(FM_SLOT *)CH_01,*(int *)((long)chip + 0x684),
                       (uint)*(byte *)((long)chip + 0x68e));
    refresh_fc_eg_slot(OPN,(FM_SLOT *)((long)chip + 0x4b48),*(int *)((long)chip + 0x688),
                       (uint)*(byte *)((long)chip + 0x68f));
    refresh_fc_eg_slot(OPN,(FM_SLOT *)((long)chip + 0x4af8),*(int *)((long)chip + 0x680),
                       (uint)*(byte *)((long)chip + 0x68d));
    refresh_fc_eg_slot(OPN,(FM_SLOT *)((long)chip + 0x4b98),*(int *)((long)chip + 0x4c2c),
                       (uint)*(byte *)((long)chip + 0x4c30));
  }
  refresh_fc_eg_chan(OPN,CH_02);
  refresh_fc_eg_chan(OPN,CH_03);
  refresh_fc_eg_chan(OPN,CH_04);
  if (length == 0) {
    update_ssg_eg_channel((FM_SLOT *)CH);
    update_ssg_eg_channel((FM_SLOT *)CH_00);
    update_ssg_eg_channel((FM_SLOT *)CH_01);
    update_ssg_eg_channel((FM_SLOT *)CH_02);
    update_ssg_eg_channel((FM_SLOT *)CH_03);
    update_ssg_eg_channel((FM_SLOT *)CH_04);
  }
  pauVar1 = (undefined1 (*) [16])((long)chip + 0x4714);
  for (uVar10 = 0; uVar10 != length; uVar10 = uVar10 + 1) {
    *pauVar1 = (undefined1  [16])0x0;
    *(undefined8 *)((long)chip + 0x4724) = 0;
    update_ssg_eg_channel((FM_SLOT *)CH);
    update_ssg_eg_channel((FM_SLOT *)CH_00);
    update_ssg_eg_channel((FM_SLOT *)CH_01);
    update_ssg_eg_channel((FM_SLOT *)CH_02);
    update_ssg_eg_channel((FM_SLOT *)CH_03);
    update_ssg_eg_channel((FM_SLOT *)CH_04);
    if (*(char *)((long)chip + 0x510a) == '\0') {
      chan_calc(OPN,CH,chnum);
      chan_calc(OPN,CH_00,chnum_00);
      chan_calc(OPN,CH_01,chnum_01);
      chan_calc(OPN,CH_02,chnum_02);
      chan_calc(OPN,CH_03,chnum_03);
      if (*(char *)((long)chip + 0x5109) == '\0') {
        chan_calc(OPN,CH_04,chnum_04);
      }
      else {
        **(int **)((long)chip + 0x50d8) = **(int **)((long)chip + 0x50d8) + iVar3;
      }
    }
    else {
      *(ulong *)((long)chip + 0x4714) = CONCAT44(iVar3,iVar3);
      *(ulong *)((long)chip + 0x471c) = CONCAT44(iVar3,iVar3);
      *(int *)((long)chip + 0x4728) = iVar3;
    }
    advance_lfo(OPN);
    uVar4 = *(int *)((long)chip + 0x6dc) + *(int *)((long)chip + 0x6e0);
    *(uint *)((long)chip + 0x6dc) = uVar4;
    while (*(uint *)((long)chip + 0x6e4) <= uVar4) {
      *(uint *)((long)chip + 0x6dc) = uVar4 - *(uint *)((long)chip + 0x6e4);
      *(int *)((long)chip + 0x6d8) = *(int *)((long)chip + 0x6d8) + 1;
      advance_eg_channel(OPN,(FM_SLOT *)CH);
      advance_eg_channel(OPN,(FM_SLOT *)CH_00);
      advance_eg_channel(OPN,(FM_SLOT *)CH_01);
      advance_eg_channel(OPN,(FM_SLOT *)CH_02);
      advance_eg_channel(OPN,(FM_SLOT *)CH_03);
      advance_eg_channel(OPN,(FM_SLOT *)CH_04);
      uVar4 = *(uint *)((long)chip + 0x6dc);
    }
    uVar4 = *(uint *)*pauVar1;
    uVar5 = 0x1fff;
    if ((0x1fff < (int)uVar4) || (uVar5 = 0xffffe000, (int)uVar4 < -0x2000)) {
      uVar4 = uVar5;
      *(uint *)*pauVar1 = uVar4;
    }
    uVar5 = *(uint *)((long)chip + 0x4718);
    uVar12 = 0x1fff;
    if ((0x1fff < (int)uVar5) || (uVar12 = 0xffffe000, (int)uVar5 < -0x2000)) {
      uVar5 = uVar12;
      *(uint *)((long)chip + 0x4718) = uVar5;
    }
    uVar12 = *(uint *)((long)chip + 0x471c);
    uVar8 = 0x1fff;
    if ((0x1fff < (int)uVar12) || (uVar8 = 0xffffe000, (int)uVar12 < -0x2000)) {
      uVar12 = uVar8;
      *(uint *)((long)chip + 0x471c) = uVar12;
    }
    uVar8 = *(uint *)((long)chip + 0x4720);
    uVar14 = 0x1fff;
    if ((0x1fff < (int)uVar8) || (uVar14 = 0xffffe000, (int)uVar8 < -0x2000)) {
      uVar8 = uVar14;
      *(uint *)((long)chip + 0x4720) = uVar8;
    }
    uVar14 = *(uint *)((long)chip + 0x4724);
    uVar11 = 0x1fff;
    if ((0x1fff < (int)uVar14) || (uVar11 = 0xffffe000, (int)uVar14 < -0x2000)) {
      uVar14 = uVar11;
      *(uint *)((long)chip + 0x4724) = uVar14;
    }
    uVar11 = *(uint *)((long)chip + 0x4728);
    uVar13 = 0x1fff;
    if ((0x1fff < (int)uVar11) || (uVar13 = 0xffffe000, (int)uVar11 < -0x2000)) {
      uVar11 = uVar13;
      *(uint *)((long)chip + 0x4728) = uVar11;
    }
    iVar9 = (uVar8 & *(uint *)((long)chip + 0x6c4)) + (uVar12 & *(uint *)((long)chip + 0x6bc)) +
            (uVar5 & *(uint *)((long)chip + 0x6b4)) + (uVar4 & *(uint *)((long)chip + 0x6ac));
    uVar13 = iVar3 * 2;
    if (*(char *)((long)chip + 0x510a) == '\0') {
      iVar9 = iVar9 + (uVar14 & *(uint *)((long)chip + 0x6cc));
      uVar13 = *(uint *)((long)chip + 0x6c8) & uVar14;
    }
    iVar6 = (*(uint *)((long)chip + 0x6d0) & uVar11) + uVar13 +
            (*(uint *)((long)chip + 0x6b8) & uVar12) + (*(uint *)((long)chip + 0x6c0) & uVar8) +
            (*(uint *)((long)chip + 0x6b0) & uVar5) + (*(uint *)((long)chip + 0x6a8) & uVar4);
    iVar9 = (uVar11 & *(uint *)((long)chip + 0x6d4)) + iVar9;
    bVar2 = *(byte *)((long)chip + 0x5111);
    if (bVar2 == 0) {
      *(int *)((long)chip + 0x5114) = iVar6;
      *(int *)((long)chip + 0x5118) = iVar9;
    }
    else {
      if ((bVar2 & 1) != 0) {
        *(int *)((long)chip + 0x5114) = iVar6;
      }
      if ((bVar2 & 2) != 0) {
        *(int *)((long)chip + 0x5118) = iVar9;
      }
      *(byte *)((long)chip + 0x5111) = bVar2 ^ 3;
      iVar6 = *(int *)((long)chip + 0x5114);
    }
    local_68[uVar10] = iVar6;
    local_60[uVar10] = *(DEV_SMPL *)((long)chip + 0x5118);
    *(char *)((long)chip + 0x69c) = *(char *)((long)chip + 0x69c) << 1;
    iVar9 = *(int *)((long)chip + 0x23c);
    if ((((iVar9 != 0) && (*(long *)((long)chip + 0x648) == 0)) &&
        (iVar7 = (int)(*(double *)((long)chip + 0x220) * 4096.0), iVar6 = iVar9 - iVar7,
        *(int *)((long)chip + 0x23c) = iVar6, iVar6 == 0 || iVar9 < iVar7)) &&
       (TimerAOver((FM_ST *)((long)chip + 0x210)), (*(uint *)((long)chip + 0x230) & 0xc0) == 0x80))
    {
      CSMKeyControl(OPN,CH_01);
    }
    if ((*(byte *)((long)chip + 0x69c) & 2) != 0) {
      FM_KEYOFF_CSM(CH_01,0);
      FM_KEYOFF_CSM(CH_01,2);
      FM_KEYOFF_CSM(CH_01,1);
      FM_KEYOFF_CSM(CH_01,3);
      *(undefined1 *)((long)chip + 0x69c) = 0;
    }
  }
  iVar3 = *(int *)((long)chip + 0x244);
  if (((iVar3 != 0) && (*(long *)((long)chip + 0x648) == 0)) &&
     (iVar6 = (int)((double)length * *(double *)((long)chip + 0x220) * 4096.0),
     iVar9 = iVar3 - iVar6, *(int *)((long)chip + 0x244) = iVar9, iVar9 == 0 || iVar3 < iVar6)) {
    TimerBOver((FM_ST *)((long)chip + 0x210));
    return;
  }
  return;
}

Assistant:

void ym2612_update_one(void *chip, UINT32 length, DEV_SMPL **buffer)
{
	YM2612 *F2612 = (YM2612 *)chip;
	FM_OPN *OPN  = &F2612->OPN;
	INT32 *out_fm = OPN->out_fm;
	UINT32 i;
	DEV_SMPL  *bufL,*bufR;
	INT32 dacout;
	FM_CH   *cch[6];
	INT32 lt,rt;

	/* set buffer */
	if (buffer != NULL)
	{
		bufL = buffer[0];
		bufR = buffer[1];
	}
	else
	{
		// for internal 0-sample update
		bufL = bufR = NULL;
	}

	cch[0]   = &F2612->CH[0];
	cch[1]   = &F2612->CH[1];
	cch[2]   = &F2612->CH[2];
	cch[3]   = &F2612->CH[3];
	cch[4]   = &F2612->CH[4];
	cch[5]   = &F2612->CH[5];
	
	if (! F2612->MuteDAC)
		dacout = F2612->dacout << 5;    /* level unknown */
	else
		dacout = 0;

	/* refresh PG and EG */
	refresh_fc_eg_chan( OPN, cch[0] );
	refresh_fc_eg_chan( OPN, cch[1] );
	if( (OPN->ST.mode & 0xc0) )
	{
		/* 3SLOT MODE */
		if( cch[2]->SLOT[SLOT1].Incr==-1)
		{
			refresh_fc_eg_slot(OPN, &cch[2]->SLOT[SLOT1] , OPN->SL3.fc[1] , OPN->SL3.kcode[1] );
			refresh_fc_eg_slot(OPN, &cch[2]->SLOT[SLOT2] , OPN->SL3.fc[2] , OPN->SL3.kcode[2] );
			refresh_fc_eg_slot(OPN, &cch[2]->SLOT[SLOT3] , OPN->SL3.fc[0] , OPN->SL3.kcode[0] );
			refresh_fc_eg_slot(OPN, &cch[2]->SLOT[SLOT4] , cch[2]->fc , cch[2]->kcode );
		}
	}
	else
		refresh_fc_eg_chan( OPN, cch[2] );
	refresh_fc_eg_chan( OPN, cch[3] );
	refresh_fc_eg_chan( OPN, cch[4] );
	refresh_fc_eg_chan( OPN, cch[5] );
	if (! length)
	{
		update_ssg_eg_channel(&cch[0]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[1]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[2]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[3]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[4]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[5]->SLOT[SLOT1]);
	}


	/* buffering */
	for(i=0; i < length ; i++)
	{
		/* clear outputs */
		out_fm[0] = 0;
		out_fm[1] = 0;
		out_fm[2] = 0;
		out_fm[3] = 0;
		out_fm[4] = 0;
		out_fm[5] = 0;

		/* update SSG-EG output */
		update_ssg_eg_channel(&cch[0]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[1]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[2]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[3]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[4]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[5]->SLOT[SLOT1]);

		/* calculate FM */
		if (! F2612->dac_test)
		{
			chan_calc(OPN, cch[0], 0 );
			chan_calc(OPN, cch[1], 1 );
			chan_calc(OPN, cch[2], 2 );
			chan_calc(OPN, cch[3], 3 );
			chan_calc(OPN, cch[4], 4 );
			if( F2612->dacen )
				*cch[5]->connect4 += dacout;
			else
				chan_calc(OPN, cch[5], 5 );
		}
		else
		{
			out_fm[0] = out_fm[1] = dacout;
			out_fm[2] = out_fm[3] = dacout;
			out_fm[5] = dacout;
		}

		/* advance LFO */
		advance_lfo(OPN);

		/* advance envelope generator */
		OPN->eg_timer += OPN->eg_timer_add;
		while (OPN->eg_timer >= OPN->eg_timer_overflow)
		{
			OPN->eg_timer -= OPN->eg_timer_overflow;
			OPN->eg_cnt++;

			advance_eg_channel(OPN, &cch[0]->SLOT[SLOT1]);
			advance_eg_channel(OPN, &cch[1]->SLOT[SLOT1]);
			advance_eg_channel(OPN, &cch[2]->SLOT[SLOT1]);
			advance_eg_channel(OPN, &cch[3]->SLOT[SLOT1]);
			advance_eg_channel(OPN, &cch[4]->SLOT[SLOT1]);
			advance_eg_channel(OPN, &cch[5]->SLOT[SLOT1]);
		}

		/* channels accumulator output clipping (14-bit max) */
		if (out_fm[0] > 8191) out_fm[0] = 8191;
		else if (out_fm[0] < -8192) out_fm[0] = -8192;
		if (out_fm[1] > 8191) out_fm[1] = 8191;
		else if (out_fm[1] < -8192) out_fm[1] = -8192;
		if (out_fm[2] > 8191) out_fm[2] = 8191;
		else if (out_fm[2] < -8192) out_fm[2] = -8192;
		if (out_fm[3] > 8191) out_fm[3] = 8191;
		else if (out_fm[3] < -8192) out_fm[3] = -8192;
		if (out_fm[4] > 8191) out_fm[4] = 8191;
		else if (out_fm[4] < -8192) out_fm[4] = -8192;
		if (out_fm[5] > 8191) out_fm[5] = 8191;
		else if (out_fm[5] < -8192) out_fm[5] = -8192;

		/* 6-channels mixing  */
		lt  = ((out_fm[0]>>0) & OPN->pan[0]);
		rt  = ((out_fm[0]>>0) & OPN->pan[1]);
		lt += ((out_fm[1]>>0) & OPN->pan[2]);
		rt += ((out_fm[1]>>0) & OPN->pan[3]);
		lt += ((out_fm[2]>>0) & OPN->pan[4]);
		rt += ((out_fm[2]>>0) & OPN->pan[5]);
		lt += ((out_fm[3]>>0) & OPN->pan[6]);
		rt += ((out_fm[3]>>0) & OPN->pan[7]);
		if (! F2612->dac_test)
		{
			lt += ((out_fm[4]>>0) & OPN->pan[8]);
			rt += ((out_fm[4]>>0) & OPN->pan[9]);
		}
		else
		{
			// DAC test mode ignores panning for channel 4
			lt += dacout;
			lt += dacout;
		}
		lt += ((out_fm[5]>>0) & OPN->pan[10]);
		rt += ((out_fm[5]>>0) & OPN->pan[11]);

		/* buffering */
		if (F2612->WaveOutMode)
		{
			if (F2612->WaveOutMode & 0x01)
				F2612->WaveL = lt;
			if (F2612->WaveOutMode & 0x02)
				F2612->WaveR = rt;
			F2612->WaveOutMode ^= 0x03;
		}
		else
		{
			F2612->WaveL = lt;
			F2612->WaveR = rt;
		}
		bufL[i] = F2612->WaveL;
		bufR[i] = F2612->WaveR;

		/* CSM mode: if CSM Key ON has occured, CSM Key OFF need to be sent       */
		/* only if Timer A does not overflow again (i.e CSM Key ON not set again) */
		OPN->SL3.key_csm <<= 1;

		/* timer A control */
		INTERNAL_TIMER_A( &OPN->ST , cch[2] )

		/* CSM Mode Key ON still disabled */
		if (OPN->SL3.key_csm & 2)
		{
			/* CSM Mode Key OFF (verified by Nemesis on real hardware) */
			FM_KEYOFF_CSM(cch[2],SLOT1);
			FM_KEYOFF_CSM(cch[2],SLOT2);
			FM_KEYOFF_CSM(cch[2],SLOT3);
			FM_KEYOFF_CSM(cch[2],SLOT4);
			OPN->SL3.key_csm = 0;
		}
	}

	/* timer B control */
	INTERNAL_TIMER_B(&OPN->ST,length)
}